

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2_test.cpp
# Opt level: O0

void __thiscall
HLD_PrefixSumsCorrect_Test::HLD_PrefixSumsCorrect_Test(HLD_PrefixSumsCorrect_Test *this)

{
  HLD_PrefixSumsCorrect_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HLD_PrefixSumsCorrect_Test_001b9fa0;
  return;
}

Assistant:

TEST(HLD, PrefixSumsCorrect) {
	int n = 30;
	rep(i, 0, 10) {
		gen(n);
		initHLD();
		rep(a, 0, n) rep(b, 0, n) {
			ll val = quepdate(a, b, false, ZERO);
			for (int ta = a, tb = b; ta != tb; val -= flat_quepdate(in[ta], in[ta], false, 0), ta = par[ta])
				if (depth[ta] < depth[tb])
					swap(ta, tb);

			EXPECT_EQ(val, 0);
		}
	}
}